

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

void __thiscall ClipperLib::Clipper::AddHorzJoin(Clipper *this,TEdge *e,int idx)

{
  pointer *pppHVar1;
  iterator __position;
  HorzJoinRec *hj;
  HorzJoinRec *local_20;
  
  local_20 = (HorzJoinRec *)operator_new(0x10);
  local_20->edge = e;
  local_20->savedIdx = idx;
  __position._M_current =
       (this->m_HorizJoins).
       super__Vector_base<ClipperLib::HorzJoinRec_*,_std::allocator<ClipperLib::HorzJoinRec_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_HorizJoins).
      super__Vector_base<ClipperLib::HorzJoinRec_*,_std::allocator<ClipperLib::HorzJoinRec_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<ClipperLib::HorzJoinRec*,std::allocator<ClipperLib::HorzJoinRec*>>::
    _M_realloc_insert<ClipperLib::HorzJoinRec*const&>
              ((vector<ClipperLib::HorzJoinRec*,std::allocator<ClipperLib::HorzJoinRec*>> *)
               &this->m_HorizJoins,__position,&local_20);
  }
  else {
    *__position._M_current = local_20;
    pppHVar1 = &(this->m_HorizJoins).
                super__Vector_base<ClipperLib::HorzJoinRec_*,_std::allocator<ClipperLib::HorzJoinRec_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppHVar1 = *pppHVar1 + 1;
  }
  return;
}

Assistant:

void Clipper::AddHorzJoin(TEdge *e, int idx)
{
  HorzJoinRec* hj = new HorzJoinRec;
  hj->edge = e;
  hj->savedIdx = idx;
  m_HorizJoins.push_back(hj);
}